

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O0

void quantize_1(float *src,void *dst,int n,int k)

{
  float fVar1;
  int in_ECX;
  int in_EDX;
  float *in_RSI;
  long in_RDI;
  float fVar2;
  int b_1;
  int b;
  uint8_t q;
  float v_1;
  int l_1;
  int s;
  float id;
  float d;
  float v;
  int l;
  float max;
  float min;
  int i;
  int j;
  uint64_t pp [4];
  char *p0;
  ulong local_98;
  int local_80;
  int local_7c;
  int local_70;
  int local_6c;
  int local_5c;
  float local_58;
  float local_54;
  int local_50;
  int local_4c;
  ulong local_48 [5];
  float *local_20;
  int local_18;
  int local_14;
  long local_8;
  
  local_20 = in_RSI;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  for (local_4c = 0; local_4c < local_14; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < local_18 / 0x40; local_50 = local_50 + 1) {
      local_54 = 3.4028235e+38;
      local_58 = -3.4028235e+38;
      for (local_5c = 0; local_5c < 0x40; local_5c = local_5c + 1) {
        fVar2 = *(float *)(local_8 + (long)(local_4c * local_18 + local_50 * 0x40 + local_5c) * 4);
        if (fVar2 < local_54) {
          local_54 = fVar2;
        }
        if (local_58 < fVar2) {
          local_58 = fVar2;
        }
      }
      fVar2 = (local_58 - local_54) / 15.0;
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        fVar1 = 1.0 / fVar2;
      }
      else {
        fVar1 = 0.0;
      }
      *local_20 = local_54;
      local_20[1] = fVar2;
      local_20 = local_20 + 2;
      for (local_6c = 0; local_6c < 1; local_6c = local_6c + 1) {
        memset(local_48,0,0x20);
        for (local_70 = 0; local_70 < 0x40; local_70 = local_70 + 1) {
          fVar2 = *(float *)(local_8 +
                            (long)(local_4c * local_18 + local_50 * 0x40 + local_6c * 0x40 +
                                  local_70) * 4);
          for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
            if (((int)((fVar2 - local_54) * fVar1) & 0xffU & 1 << ((byte)local_7c & 0x1f)) == 0) {
              local_98 = 0;
            }
            else {
              local_98 = 1L << ((byte)local_70 & 0x3f);
            }
            local_48[local_7c] = local_98 | local_48[local_7c];
          }
        }
        for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
          *(ulong *)local_20 = local_48[local_80];
          local_20 = local_20 + 2;
        }
      }
    }
  }
  return;
}

Assistant:

void quantize_1(const float * src, void * dst, int n, int k) {
    char * p0 = dst;

    gq_quant_t pp[QB];

    for (int j = 0; j < n; j++) {
        for (int i = 0; i < k/QK; i++) {
            float min = FLT_MAX;
            float max = -FLT_MAX;

            // find min/max
#ifdef __ARM_NEON
            {
                float32x4_t minv = vdupq_n_f32(FLT_MAX);
                float32x4_t maxv = vdupq_n_f32(-FLT_MAX);

                for (int l = 0; l < QK; l += 4) {
                    float32x4_t v = vld1q_f32(src + j*k + i*QK + l);
                    minv = vminq_f32(minv, v);
                    maxv = vmaxq_f32(maxv, v);
                }

                float32x2_t minv32 = vpmin_f32(vget_low_f32(minv), vget_high_f32(minv));
                float32x2_t maxv32 = vpmax_f32(vget_low_f32(maxv), vget_high_f32(maxv));

                min = MIN(vget_lane_f32(minv32, 0), vget_lane_f32(minv32, 1));
                max = MAX(vget_lane_f32(maxv32, 0), vget_lane_f32(maxv32, 1));

                //printf("SIMD min/max: %f %f\n", min, max);
            }
#else
            {
                for (int l = 0; l < QK; l++) {
                    const float v = src[j*k + i*QK + l];
                    if (v < min) min = v;
                    if (v > max) max = v;
                }

                //printf("NORM min/max: %f %f\n", min, max);
            }
#endif

            const float d = (max - min) / ((1 << QB) - 1);
            const float id = d ? 1.0/d : 0.0;

            memcpy(p0, &min, sizeof(float)); p0 += sizeof(float);
            memcpy(p0, &d,   sizeof(float)); p0 += sizeof(float);

            //printf("min/max/d/id: %f %f %f %f\n", min, max, d, id);

            for (int s = 0; s < QK/gq_t_bits; ++s) {
                memset(pp, 0, sizeof(pp));

                for (int l = 0; l < gq_t_bits; l++) {
                    const   float v = src[j*k + i*QK + s*gq_t_bits + l];
                    const uint8_t q = (v - min)*id;

                    for (int b = 0; b < QB; b++) {
                        pp[b] |= q & (1 << b) ? (1ULL << l) : 0;
                    }
                }

                for (int b = 0; b < QB; b++) {
                    memcpy(p0, &pp[b], sizeof(gq_quant_t)); p0 += sizeof(gq_quant_t);
                }
            }
        }
    }
}